

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

QList<QFontDatabase::WritingSystem> * QFontDatabase::writingSystems(void)

{
  long lVar1;
  QtFontFamily *pQVar2;
  bool bVar3;
  QFontDatabasePrivate *pQVar4;
  QMutexLocker<QRecursiveMutex> *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  uint x_1;
  uint x;
  QtFontFamily *family;
  int i;
  quint64 writingSystemsFound;
  QFontDatabasePrivate *d;
  QList<QFontDatabase::WritingSystem> *list;
  QMutexLocker<QRecursiveMutex> locker;
  undefined4 in_stack_ffffffffffffff98;
  parameter_type in_stack_ffffffffffffff9c;
  QMutexLocker<QRecursiveMutex> *this;
  uint local_4c;
  uint local_44;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  quint64 local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            (this,(QRecursiveMutex *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pQVar4 = QFontDatabasePrivate::ensureFontDatabase();
  local_30 = 0;
  for (iVar5 = 0; iVar5 < pQVar4->count; iVar5 = iVar5 + 1) {
    pQVar2 = pQVar4->families[iVar5];
    bVar3 = QtFontFamily::ensurePopulated
                      ((QtFontFamily *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                      );
    if ((bVar3) && (pQVar2->count != 0)) {
      for (local_44 = 1; local_44 < 0x22; local_44 = local_44 + 1) {
        if ((pQVar2->writingSystems[local_44] & 1) != 0) {
          local_30 = 1L << ((byte)local_44 & 0x3f) | local_30;
        }
      }
    }
  }
  QMutexLocker<QRecursiveMutex>::unlock(this);
  this->m_mutex = (QRecursiveMutex *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this->m_isLocked = &DAT_aaaaaaaaaaaaaaaa;
  this[1].m_mutex = (QRecursiveMutex *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QFontDatabase::WritingSystem>::QList((QList<QFontDatabase::WritingSystem> *)0x741470);
  qPopulationCount(local_30);
  QList<QFontDatabase::WritingSystem>::reserve
            ((QList<QFontDatabase::WritingSystem> *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),
             in_stack_00000008);
  for (local_4c = 1; local_4c < 0x22; local_4c = local_4c + 1) {
    if ((local_30 & 1L << ((byte)local_4c & 0x3f)) != 0) {
      QList<QFontDatabase::WritingSystem>::push_back
                ((QList<QFontDatabase::WritingSystem> *)this,in_stack_ffffffffffffff9c);
    }
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<QFontDatabase::WritingSystem> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QFontDatabase::WritingSystem> QFontDatabase::writingSystems()
{
    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    quint64 writingSystemsFound = 0;
    static_assert(WritingSystemsCount < 64);

    for (int i = 0; i < d->count; ++i) {
        QtFontFamily *family = d->families[i];
        if (!family->ensurePopulated())
            continue;

        if (family->count == 0)
            continue;
        for (uint x = Latin; x < uint(WritingSystemsCount); ++x) {
            if (family->writingSystems[x] & QtFontFamily::Supported)
                writingSystemsFound |= quint64(1) << x;
        }
    }

    // mutex protection no longer needed - just working on local data now:
    locker.unlock();

    QList<WritingSystem> list;
    list.reserve(qPopulationCount(writingSystemsFound));
    for (uint x = Latin ; x < uint(WritingSystemsCount); ++x) {
        if (writingSystemsFound & (quint64(1) << x))
            list.push_back(WritingSystem(x));
    }
    return list;
}